

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form1_BinaryDilate(BinaryDilateForm1 BinaryDilate)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_type __n;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fillData;
  
  uVar2 = rand();
  __n = 0x14;
  if (0x14 < (uint)((ulong)uVar2 % 200)) {
    __n = (ulong)uVar2 % 200;
  }
  input._vptr_ImageTemplate._0_1_ = 0xff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&fillData,__n,(value_type_conflict1 *)&input,(allocator_type *)&output);
  input._vptr_ImageTemplate._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&fillData,(uchar *)&input);
  Unit_Test::randomImage(&input,&fillData);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,&input);
  uVar2 = rand();
  uVar3 = rand();
  (*BinaryDilate)(&output,uVar2 % 5 + (uint)(uVar2 % 5 == 0),uVar3 % 5 + (uint)(uVar3 % 5 == 0));
  bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_char>>(&input,&output);
  if (bVar1) {
    bVar1 = Unit_Test::verifyImage(&output,0xff);
  }
  else {
    bVar1 = false;
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&fillData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool form1_BinaryDilate(BinaryDilateForm1 BinaryDilate)
    {
        std::vector< uint8_t > fillData( randomValue<uint32_t>(20, 200), 255u );
        fillData.push_back(0u);

        const PenguinV_Image::Image input = randomImage( fillData );
        PenguinV_Image::Image output = input;

        const uint32_t dilationX = randomValue<uint32_t>(1, 5);
        const uint32_t dilationY = randomValue<uint32_t>(1, 5);

        BinaryDilate(output, dilationX, dilationY);

        return equalSize( input, output ) && verifyImage( output, 255u );
    }